

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QAnimationTimer::~QAnimationTimer(QAnimationTimer *this)

{
  int *piVar1;
  
  *(undefined ***)this = &PTR_metaObject_0069cfa8;
  piVar1 = *(int **)(this + 0x60);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x60),8,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x40);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x40),8,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x28);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x28),8,0x10);
    }
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QAnimationTimer::~QAnimationTimer()
    = default;